

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_float_convert.cpp
# Opt level: O2

double local_float_convert::get_random_float<double,_1,75>(void)

{
  double dVar1;
  result_type_conflict3 rVar2;
  result_type_conflict2 rVar3;
  result_type rVar4;
  int iVar5;
  undefined4 local_18;
  uint uStack_14;
  
  if ((get_random_float<double,-1,75>()::dist_man == '\0') &&
     (iVar5 = __cxa_guard_acquire(&get_random_float<double,-1,75>()::dist_man), iVar5 != 0)) {
    get_random_float<double,_-1,_75>::dist_man._M_param._M_b._4_4_ = 0x3ff00000;
    get_random_float<double,_-1,_75>::dist_man._M_param._0_12_ = ZEXT812(0);
    __cxa_guard_release(&get_random_float<double,-1,75>()::dist_man);
  }
  if ((get_random_float<double,-1,75>()::dist_sgn == '\0') &&
     (iVar5 = __cxa_guard_acquire(&get_random_float<double,-1,75>()::dist_sgn), iVar5 != 0)) {
    get_random_float<double,_-1,_75>::dist_sgn._M_param._M_a = 0;
    get_random_float<double,_-1,_75>::dist_sgn._M_param._M_b = 1;
    __cxa_guard_release(&get_random_float<double,-1,75>()::dist_sgn);
  }
  if ((get_random_float<double,-1,75>()::dist_e10 == '\0') &&
     (iVar5 = __cxa_guard_acquire(&get_random_float<double,-1,75>()::dist_e10), iVar5 != 0)) {
    get_random_float<double,_-1,_75>::dist_e10._M_param._M_a = -1;
    get_random_float<double,_-1,_75>::dist_e10._M_param._M_b = 0x4b;
    __cxa_guard_release(&get_random_float<double,-1,75>()::dist_e10);
  }
  engine_e10();
  rVar3 = std::uniform_int_distribution<int>::operator()
                    (&get_random_float<double,_-1,_75>::dist_e10,&engine_e10::my_engine_e10);
  dVar1 = pow(10.0,(double)rVar3);
  engine_man();
  rVar2 = std::uniform_real_distribution<double>::operator()
                    (&get_random_float<double,_-1,_75>::dist_man,&engine_man::my_engine_man);
  engine_sgn();
  rVar4 = std::uniform_int_distribution<unsigned_int>::operator()
                    (&get_random_float<double,_-1,_75>::dist_sgn,&engine_sgn::my_engine_sgn);
  local_18 = SUB84(rVar2 * dVar1,0);
  uStack_14 = (uint)((ulong)(rVar2 * dVar1) >> 0x20);
  if (rVar4 != 0) {
    uStack_14 = uStack_14 ^ 0x80000000;
  }
  return (double)CONCAT44(uStack_14,local_18);
}

Assistant:

auto get_random_float() -> FloatingPointType
  {
    using local_builtin_float_type = FloatingPointType;

    static std::uniform_real_distribution<local_builtin_float_type>
    dist_man
    (
      static_cast<local_builtin_float_type>(0.0F),
      static_cast<local_builtin_float_type>(1.0F)
    );

    static auto dist_sgn = unsigned_dist_maker(static_cast<unsigned>(UINT8_C(0)),
                                               static_cast<unsigned>(UINT8_C(1)));

    static auto dist_e10 = unsigned_dist_maker(LoExp10, HiExp10);

    using std::pow;

    const auto p10 = dist_e10(engine_e10());

    const local_builtin_float_type e10 = pow(static_cast<local_builtin_float_type>(10.0F),
                                             static_cast<local_builtin_float_type>(p10));

    const local_builtin_float_type a = dist_man(engine_man()) * e10;

    const bool is_neg = (dist_sgn(engine_sgn()) != 0);

    const local_builtin_float_type f = ((!is_neg) ? a : -a);

    return f;
  }